

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall
cmTarget::IsLinkInterfaceDependentNumberMinProperty(cmTarget *this,string *p,string *config)

{
  CompatibleInterfaces *pCVar1;
  size_type sVar2;
  string *config_local;
  string *p_local;
  cmTarget *this_local;
  
  if ((this->TargetTypeValue == OBJECT_LIBRARY) || (this->TargetTypeValue == INTERFACE_LIBRARY)) {
    this_local._7_1_ = false;
  }
  else {
    pCVar1 = GetCompatibleInterfaces(this,config);
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&pCVar1->PropsNumberMin,p);
    this_local._7_1_ = sVar2 != 0;
  }
  return this_local._7_1_;
}

Assistant:

bool cmTarget::IsLinkInterfaceDependentNumberMinProperty(const std::string &p,
                                    const std::string& config) const
{
  if (this->TargetTypeValue == OBJECT_LIBRARY
      || this->TargetTypeValue == INTERFACE_LIBRARY)
    {
    return false;
    }
  return this->GetCompatibleInterfaces(config).PropsNumberMin.count(p) > 0;
}